

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration * __thiscall absl::lts_20250127::Duration::operator*=(Duration *this,double r)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint32_t uVar5;
  HiRep HVar6;
  HiRep HVar7;
  double lo_int;
  double hi_int;
  double local_38;
  double local_30;
  
  uVar1 = this->rep_lo_;
  if (0x7fefffffffffffff < (ulong)ABS(r) || uVar1 == 0xffffffff) {
    HVar7 = (HiRep)((ulong)((long)((ulong)r ^ (ulong)this->rep_hi_) < 0) + 0x7fffffffffffffff);
    uVar5 = 0xffffffff;
    goto LAB_002a95a4;
  }
  local_30 = 0.0;
  dVar2 = modf((double)(long)this->rep_hi_ * r,&local_30);
  local_38 = 0.0;
  dVar2 = modf(dVar2 + ((double)uVar1 * r) / 4000000000.0,&local_38);
  dVar2 = round(dVar2 * 4000000000.0);
  local_30 = local_30 + local_38;
  uVar5 = 0xffffffff;
  if (local_30 < 9.223372036854776e+18) {
    HVar7.lo_ = 0;
    HVar7.hi_ = 0x80000000;
    HVar6.lo_ = 0;
    HVar6.hi_ = 0x80000000;
    if (local_30 <= -9.223372036854776e+18) goto LAB_002a95a4;
    dVar3 = (double)((long)dVar2 / 4000000000) + (double)(long)local_30;
    if (dVar3 < 9.223372036854776e+18) {
      HVar7 = HVar6;
      if (-9.223372036854776e+18 < dVar3) {
        lVar4 = (long)dVar2 % 4000000000;
        HVar7 = (HiRep)((lVar4 >> 0x3f) + (long)dVar3);
        uVar5 = (uint32_t)lVar4 + 4000000000;
        if (-1 < lVar4) {
          uVar5 = (uint32_t)lVar4;
        }
      }
      goto LAB_002a95a4;
    }
  }
  HVar7.lo_ = 0xffffffff;
  HVar7.hi_ = 0x7fffffff;
LAB_002a95a4:
  this->rep_hi_ = HVar7;
  this->rep_lo_ = uVar5;
  return this;
}

Assistant:

Duration& Duration::operator*=(double r) {
  if (time_internal::IsInfiniteDuration(*this) || !IsFinite(r)) {
    const bool is_neg = std::signbit(r) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleDouble<std::multiplies>(*this, r);
}